

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O1

QWindowGeometrySpecification *
QWindowGeometrySpecification::fromArgument
          (QWindowGeometrySpecification *__return_storage_ptr__,QByteArray *a)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  int *piVar6;
  char cVar7;
  ulong uVar8;
  ulong uVar9;
  int i;
  int iVar10;
  long in_FS_OFFSET;
  bool ok;
  QArrayData *local_58 [3];
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->corner = TopLeftCorner;
  __return_storage_ptr__->xOffset = -1;
  __return_storage_ptr__->yOffset = -1;
  __return_storage_ptr__->width = -1;
  __return_storage_ptr__->height = -1;
  iVar10 = 0;
  uVar9 = 0;
  do {
    uVar1 = (a->d).size;
    iVar5 = (int)uVar9;
    if ((long)iVar5 < (long)uVar1) {
      pcVar2 = (a->d).ptr;
      cVar7 = pcVar2[iVar5];
      if (((cVar7 == '+') || (cVar7 == 'x')) || (cVar7 == '-')) {
        uVar9 = (ulong)(iVar5 + 1);
        cVar4 = cVar7;
      }
      else {
        iVar5 = -1;
        cVar4 = 'x';
        if (9 < (int)cVar7 - 0x30U) goto LAB_002cd77f;
      }
      cVar7 = cVar4;
      uVar8 = (ulong)(int)uVar9;
      if (((long)uVar8 < (long)uVar1) && ((int)pcVar2[uVar8] - 0x30U < 10)) {
        do {
          uVar9 = uVar1;
          if (uVar1 - 1 == uVar8) break;
          lVar3 = uVar8 + 1;
          uVar9 = uVar8 + 1;
          uVar8 = uVar9;
        } while ((int)pcVar2[lVar3] - 0x30U < 10);
      }
      local_39 = -0x56;
      QByteArray::mid((longlong)local_58,(longlong)a);
      iVar5 = QByteArray::toInt((bool *)local_58,(int)&local_39);
      if (local_58[0] != (QArrayData *)0x0) {
        LOCK();
        (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58[0],1,0x10);
        }
      }
      if (local_39 == '\0') {
        iVar5 = -1;
      }
    }
    else {
      cVar7 = '\0';
      iVar5 = -1;
    }
LAB_002cd77f:
    if (iVar5 < 0) break;
    if ((cVar7 == '+') || (cVar7 == '-')) {
      if (__return_storage_ptr__->xOffset < 0) {
        __return_storage_ptr__->xOffset = iVar5;
        if (cVar7 == '-') {
          __return_storage_ptr__->corner = TopRightCorner;
        }
      }
      else {
        __return_storage_ptr__->yOffset = iVar5;
        if (cVar7 == '-') {
          __return_storage_ptr__->corner =
               __return_storage_ptr__->corner == TopRightCorner | BottomLeftCorner;
        }
      }
    }
    else if (cVar7 == 'x') {
      piVar6 = &__return_storage_ptr__->height;
      if (__return_storage_ptr__->width < 0) {
        piVar6 = &__return_storage_ptr__->width;
      }
      *piVar6 = iVar5;
    }
    iVar10 = iVar10 + 1;
  } while (iVar10 != 4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QWindowGeometrySpecification QWindowGeometrySpecification::fromArgument(const QByteArray &a)
{
    QWindowGeometrySpecification result = Q_WINDOW_GEOMETRY_SPECIFICATION_INITIALIZER;
    int pos = 0;
    for (int i = 0; i < 4; ++i) {
        char op;
        const int value = nextGeometryToken(a, pos, &op);
        if (value < 0)
            break;
        switch (op) {
        case 'x':
            (result.width >= 0 ? result.height : result.width) = value;
            break;
        case '+':
        case '-':
            if (result.xOffset >= 0) {
                result.yOffset = value;
                if (op == '-')
                    result.corner = result.corner == Qt::TopRightCorner ? Qt::BottomRightCorner : Qt::BottomLeftCorner;
            } else {
                result.xOffset = value;
                if (op == '-')
                    result.corner = Qt::TopRightCorner;
            }
        }
    }
    return result;
}